

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_rsv_append_doc(fdb_kvs_handle *handle)

{
  uint64_t bmp_size;
  undefined8 uVar1;
  ulong uVar2;
  uint32_t uVar3;
  void *pvVar4;
  size_t sVar5;
  bid_t bVar6;
  long in_RDI;
  sb_rsv_bmp *rsv;
  superblock *sb;
  char doc_key [64];
  uint64_t num_docs;
  size_t i;
  docio_object *doc;
  docio_handle *handle_00;
  char local_58 [64];
  size_t local_18;
  ulong local_10;
  
  handle_00 = *(docio_handle **)(*(long *)(in_RDI + 0x48) + 0x198);
  if (((handle_00 != (docio_handle *)0x0) &&
      (doc = (docio_object *)handle_00[2].curblock, doc != (docio_object *)0x0)) &&
     (uVar3 = atomic_get_uint32_t((atomic<unsigned_int> *)handle_00,
                                  (memory_order)((ulong)doc >> 0x20)), uVar3 == 1)) {
    bmp_size._0_4_ = (doc->length).bodylen_ondisk;
    bmp_size._4_1_ = (doc->length).flag;
    bmp_size._5_1_ = (doc->length).checksum;
    bmp_size._6_2_ = (doc->length).reserved;
    local_18 = _bmp_size_to_num_docs(bmp_size);
    doc[1].length.keylen = (short)local_18;
    doc[1].length.metalen = (short)(local_18 >> 0x10);
    doc[1].length.bodylen = (int)(local_18 >> 0x20);
    if (local_18 != 0) {
      pvVar4 = calloc(local_18,8);
      doc->meta = pvVar4;
      pvVar4 = calloc(local_18,0x38);
      doc->body = pvVar4;
    }
    for (local_10 = 0; local_10 < local_18; local_10 = local_10 + 1) {
      memset((void *)((long)doc->body + local_10 * 0x38),0,0x38);
      uVar1._0_2_ = (doc->length).keylen;
      uVar1._2_2_ = (doc->length).metalen;
      uVar1._4_4_ = (doc->length).bodylen;
      sprintf(local_58,"bitmap_%lu_%d",uVar1,local_10 & 0xffffffff);
      *(char **)((long)doc->body + local_10 * 0x38 + 0x18) = local_58;
      *(undefined8 *)((long)doc->body + local_10 * 0x38 + 0x28) = 0;
      *(ulong *)((long)doc->body + local_10 * 0x38 + 0x30) =
           *(long *)&doc->timestamp + local_10 * 0x100000;
      sVar5 = strlen(local_58);
      *(short *)((long)doc->body + local_10 * 0x38) = (short)sVar5 + 1;
      *(undefined2 *)((long)doc->body + local_10 * 0x38 + 2) = 0;
      if (local_10 == local_18 - 1) {
        uVar2._0_4_ = (doc->length).bodylen_ondisk;
        uVar2._4_1_ = (doc->length).flag;
        uVar2._5_1_ = (doc->length).checksum;
        uVar2._6_2_ = (doc->length).reserved;
        *(uint *)((long)doc->body + local_10 * 0x38 + 4) = (uint)(uVar2 >> 3) & 0xfffff;
      }
      else {
        *(undefined4 *)((long)doc->body + local_10 * 0x38 + 4) = 0x100000;
      }
      *(undefined8 *)((long)doc->body + local_10 * 0x38 + 0x20) = 0;
      bVar6 = docio_append_doc_system(handle_00,doc);
      *(bid_t *)((long)doc->meta + local_10 * 8) = bVar6;
    }
    atomic_store_uint32_t
              ((atomic<unsigned_int> *)handle_00,(uint32_t)((ulong)doc >> 0x20),(memory_order)doc);
  }
  return;
}

Assistant:

void sb_rsv_append_doc(fdb_kvs_handle *handle)
{
    size_t i;
    uint64_t num_docs;
    char doc_key[64];
    struct superblock *sb = handle->file->sb;
    struct sb_rsv_bmp *rsv = NULL;

    if (!sb) {
        return;
    }

    rsv = sb->rsv_bmp;
    if (!rsv ||
        atomic_get_uint32_t(&rsv->status) != SB_RSV_INITIALIZING) {
        return;
    }

    rsv->num_bmp_docs = num_docs = _bmp_size_to_num_docs(rsv->bmp_size);
    if (num_docs) {
        rsv->bmp_doc_offset = (bid_t*)calloc(num_docs, sizeof(bid_t));
        rsv->bmp_docs = (struct docio_object*)
                        calloc(num_docs, sizeof(struct docio_object));
    }

    // bitmap doc offsets
    for (i=0; i<num_docs; ++i) {
        // append a system doc for bitmap chunk
        memset(&rsv->bmp_docs[i], 0x0, sizeof(struct docio_object));
        sprintf(doc_key, "bitmap_%" _F64 "_%d", rsv->bmp_revnum, (int)i);
        rsv->bmp_docs[i].key = (void*)doc_key;
        rsv->bmp_docs[i].meta = NULL;
        rsv->bmp_docs[i].body = rsv->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

        rsv->bmp_docs[i].length.keylen = strlen(doc_key)+1;
        rsv->bmp_docs[i].length.metalen = 0;
        if (i == num_docs - 1) {
            // the last doc
            rsv->bmp_docs[i].length.bodylen =
                (rsv->bmp_size / 8) % SB_MAX_BITMAP_DOC_SIZE;
        } else {
            // otherwise: 1MB
            rsv->bmp_docs[i].length.bodylen = SB_MAX_BITMAP_DOC_SIZE;
        }
        rsv->bmp_docs[i].seqnum = 0;
        rsv->bmp_doc_offset[i] =
            docio_append_doc_system(handle->dhandle, &rsv->bmp_docs[i]);
    }

    // now 'rsv_bmp' is available.
    atomic_store_uint32_t(&rsv->status, SB_RSV_READY);
}